

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void ConvertBGRAToRGB_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  __m128i *palVar8;
  __m128i *palVar9;
  longlong *in_RDX;
  int in_ESI;
  __m128i *in_RDI;
  __m128i in7;
  __m128i in6;
  __m128i in5;
  __m128i in4;
  __m128i in3;
  __m128i in2;
  __m128i in1;
  __m128i in0;
  __m128i *out;
  __m128i *in;
  __m128i *in3_00;
  __m128i *in2_00;
  __m128i *in1_00;
  __m128i *in0_00;
  longlong *local_120;
  __m128i *local_118;
  undefined4 in_stack_fffffffffffffef8;
  __m128i *in_stack_ffffffffffffff08;
  __m128i *in_stack_ffffffffffffff10;
  __m128i *in_stack_ffffffffffffff18;
  __m128i *in_stack_ffffffffffffff20;
  
  local_120 = in_RDX;
  local_118 = in_RDI;
  for (; 0x1f < in_ESI; in_ESI = in_ESI + -0x20) {
    lVar1 = local_118[1][0];
    lVar2 = local_118[1][1];
    in0_00 = (__m128i *)local_118[2][0];
    lVar3 = local_118[2][1];
    in2_00 = (__m128i *)local_118[3][0];
    in1_00 = (__m128i *)local_118[3][1];
    in3_00 = (__m128i *)local_118[4][1];
    lVar4 = local_118[5][0];
    lVar5 = local_118[5][1];
    lVar6 = local_118[6][0];
    lVar7 = local_118[6][1];
    palVar8 = (__m128i *)local_118[7][0];
    palVar9 = (__m128i *)local_118[7][1];
    VP8L32bToPlanar_SSE2(in0_00,in1_00,in2_00,in3_00);
    VP8L32bToPlanar_SSE2(in0_00,in1_00,in2_00,in3_00);
    VP8PlanarTo24b_SSE2(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_RDI,
                        (__m128i *)CONCAT44(in_ESI,in_stack_fffffffffffffef8));
    *local_120 = lVar1;
    local_120[1] = lVar2;
    local_120[2] = lVar4;
    local_120[3] = lVar5;
    local_120[4] = (longlong)in0_00;
    local_120[5] = lVar3;
    local_120[6] = lVar6;
    local_120[7] = lVar7;
    local_120[8] = (longlong)in2_00;
    local_120[9] = (longlong)in1_00;
    in_stack_ffffffffffffff20 = (__m128i *)(local_120 + 10);
    (*in_stack_ffffffffffffff20)[0] = (longlong)palVar8;
    local_120[0xb] = (longlong)palVar9;
    local_118 = local_118 + 8;
    local_120 = local_120 + 0xc;
    in_stack_ffffffffffffff08 = palVar8;
    in_stack_ffffffffffffff10 = palVar9;
  }
  if (0 < in_ESI) {
    VP8LConvertBGRAToRGB_C((uint32_t *)local_118,in_ESI,(uint8_t *)local_120);
  }
  return;
}

Assistant:

static void ConvertBGRAToRGB_SSE2(const uint32_t* src, int num_pixels,
                                  uint8_t* dst) {
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;

  while (num_pixels >= 32) {
    // Load the BGRA buffers.
    __m128i in0 = _mm_loadu_si128(in + 0);
    __m128i in1 = _mm_loadu_si128(in + 1);
    __m128i in2 = _mm_loadu_si128(in + 2);
    __m128i in3 = _mm_loadu_si128(in + 3);
    __m128i in4 = _mm_loadu_si128(in + 4);
    __m128i in5 = _mm_loadu_si128(in + 5);
    __m128i in6 = _mm_loadu_si128(in + 6);
    __m128i in7 = _mm_loadu_si128(in + 7);
    VP8L32bToPlanar_SSE2(&in0, &in1, &in2, &in3);
    VP8L32bToPlanar_SSE2(&in4, &in5, &in6, &in7);
    // At this points, in1/in5 contains red only, in2/in6 green only ...
    // Pack the colors in 24b RGB.
    VP8PlanarTo24b_SSE2(&in1, &in5, &in2, &in6, &in3, &in7);
    _mm_storeu_si128(out + 0, in1);
    _mm_storeu_si128(out + 1, in5);
    _mm_storeu_si128(out + 2, in2);
    _mm_storeu_si128(out + 3, in6);
    _mm_storeu_si128(out + 4, in3);
    _mm_storeu_si128(out + 5, in7);
    in += 8;
    out += 6;
    num_pixels -= 32;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGB_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}